

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  uint uVar1;
  SPIREntryPoint *pSVar2;
  ulong uVar3;
  SPIRConstant *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte bVar5;
  string local_60;
  uint32_t local_3c;
  SpecializationConstant *local_38;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y;
  local_38 = wg_z;
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  if ((pSVar2->workgroup_size).constant == 0) {
    uVar3 = (pSVar2->flags).lower;
    uVar1 = (wg_x->id).id;
    if (uVar1 != 0) {
      bVar5 = (byte)(uint)(uVar3 >> 0x26) & 1;
      goto LAB_00122f8c;
    }
    if ((uVar3 >> 0x26 & 1) == 0) {
      bVar5 = 0;
LAB_00123063:
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_x = ",(char (*) [16])&pSVar2->workgroup_size,
                 (uint *)ts_1);
      goto LAB_00123082;
    }
    uVar3 = (ulong)(pSVar2->workgroup_size).id_x;
    if (uVar3 == 0) {
      bVar5 = 1;
      goto LAB_00123063;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar3);
    local_3c = (pSVar4->m).c[0].r[0].u32;
    join<char_const(&)[16],unsigned_int>
              (&local_60,(spirv_cross *)"local_size_x = ",(char (*) [16])&local_3c,(uint *)ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    uVar1 = (wg_y->id).id;
    bVar5 = 1;
    if (uVar1 == 0) goto LAB_001230e0;
LAB_001230aa:
    if ((this->options).vulkan_semantics == true) {
      join<char_const(&)[19],unsigned_int_const&>
                (&local_60,(spirv_cross *)"local_size_y_id = ",(char (*) [19])&wg_y->constant_id,
                 (uint *)ts_1);
    }
    else {
      pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar1);
      join<char_const(&)[16],std::__cxx11::string&>
                (&local_60,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&pSVar4->specialization_constant_macro_name,ts_1);
    }
LAB_001231a8:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    uVar1 = (local_38->id).id;
    if (uVar1 == 0) {
      if (bVar5 != 0) {
LAB_001231fb:
        uVar3 = (ulong)(pSVar2->workgroup_size).id_z;
        if (uVar3 != 0) {
          pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + uVar3);
          local_3c = (pSVar4->m).c[0].r[0].u32;
          join<char_const(&)[16],unsigned_int>
                    (&local_60,(spirv_cross *)"local_size_z = ",(char (*) [16])&local_3c,
                     (uint *)ts_1);
          goto LAB_0012328a;
        }
      }
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&(pSVar2->workgroup_size).z,(uint *)ts_1);
      goto LAB_0012328a;
    }
  }
  else {
    uVar1 = (wg_x->id).id;
    bVar5 = 0;
    if (uVar1 == 0) goto LAB_00123063;
LAB_00122f8c:
    if ((this->options).vulkan_semantics == true) {
      join<char_const(&)[19],unsigned_int_const&>
                (&local_60,(spirv_cross *)"local_size_x_id = ",(char (*) [19])&wg_x->constant_id,
                 (uint *)ts_1);
    }
    else {
      pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar1);
      join<char_const(&)[16],std::__cxx11::string&>
                (&local_60,(spirv_cross *)"local_size_x = ",
                 (char (*) [16])&pSVar4->specialization_constant_macro_name,ts_1);
    }
LAB_00123082:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    uVar1 = (wg_y->id).id;
    if (uVar1 != 0) goto LAB_001230aa;
    if (bVar5 == 0) {
      bVar5 = 0;
LAB_00123189:
      join<char_const(&)[16],unsigned_int&>
                (&local_60,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&(pSVar2->workgroup_size).y,(uint *)ts_1);
      goto LAB_001231a8;
    }
LAB_001230e0:
    uVar3 = (ulong)(pSVar2->workgroup_size).id_y;
    if (uVar3 == 0) {
      bVar5 = 1;
      goto LAB_00123189;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar3);
    local_3c = (pSVar4->m).c[0].r[0].u32;
    join<char_const(&)[16],unsigned_int>
              (&local_60,(spirv_cross *)"local_size_y = ",(char (*) [16])&local_3c,(uint *)ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    uVar1 = (local_38->id).id;
    if (uVar1 == 0) goto LAB_001231fb;
  }
  if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_60,(spirv_cross *)"local_size_z_id = ",(char (*) [19])&local_38->constant_id,
               (uint *)ts_1);
  }
  else {
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar1);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_60,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&pSVar4->specialization_constant_macro_name,ts_1);
  }
LAB_0012328a:
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();
	bool builtin_workgroup = execution.workgroup_size.constant != 0;
	bool use_local_size_id = !builtin_workgroup && execution.flags.get(ExecutionModeLocalSizeId);

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_x)
		arguments.push_back(join("local_size_x = ", get<SPIRConstant>(execution.workgroup_size.id_x).scalar()));
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_y)
		arguments.push_back(join("local_size_y = ", get<SPIRConstant>(execution.workgroup_size.id_y).scalar()));
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_z)
		arguments.push_back(join("local_size_z = ", get<SPIRConstant>(execution.workgroup_size.id_z).scalar()));
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}